

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O3

void __thiscall cppcms::plugin::scope::scope(scope *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  _data *p_Var2;
  value v;
  copyable local_20;
  
  p_Var2 = (_data *)operator_new(0x68);
  (p_Var2->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p_Var2->pattern)._M_dataplus._M_p = (pointer)0x0;
  (p_Var2->pattern)._M_string_length = 0;
  (p_Var2->pattern).field_2._M_allocated_capacity = 0;
  (p_Var2->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (p_Var2->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)&(p_Var2->pattern).field_2 + 8) = 0;
  *(undefined8 *)&(p_Var2->objects)._M_t._M_impl = 0;
  *(undefined8 *)&(p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(p_Var2->objects)._M_t._M_impl.super__Rb_tree_header;
  (p_Var2->pattern)._M_dataplus._M_p = (pointer)&(p_Var2->pattern).field_2;
  (p_Var2->pattern).field_2._M_local_buf[0] = '\0';
  (p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (p_Var2->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->d).ptr_ = p_Var2;
  service::load_settings((service *)&local_20,argc,argv);
  init(this,(EVP_PKEY_CTX *)&local_20);
  json::value::copyable::~copyable(&local_20);
  return;
}

Assistant:

scope::scope(int argc,char **argv) : d(new scope::_data())
{
	json::value v = service::load_settings(argc,argv);
	init(v);
}